

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadBoneHierarchy(OgreXmlSerializer *this,Skeleton *skeleton)

{
  Bone *this_00;
  bool bVar1;
  string *__lhs;
  DeadlyImportError *pDVar2;
  size_type sVar3;
  reference ppBVar4;
  Bone *bone_1;
  size_t len;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Bone *local_a0;
  Bone *parent;
  Bone *bone;
  string parentName;
  string name;
  allocator<char> local_39;
  string local_38;
  Skeleton *local_18;
  Skeleton *skeleton_local;
  OgreXmlSerializer *this_local;
  
  local_18 = skeleton;
  skeleton_local = (Skeleton *)this;
  bVar1 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::empty
                    (&skeleton->bones);
  if (bVar1) {
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Cannot read <bonehierarchy> for a Skeleton without bones",
               &local_39);
    DeadlyImportError::DeadlyImportError(pDVar2,&local_38);
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  while( true ) {
    __lhs = NextNode_abi_cxx11_(this);
    bVar1 = std::operator==(__lhs,nnBoneParent);
    if (!bVar1) {
      len = 0;
      sVar3 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::size
                        (&local_18->bones);
      for (; len < sVar3; len = len + 1) {
        ppBVar4 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::
                  operator[](&local_18->bones,len);
        this_00 = *ppBVar4;
        bVar1 = Bone::IsParented(this_00);
        if (!bVar1) {
          Bone::CalculateWorldMatrixAndDefaultPose(this_00,local_18);
        }
      }
      return;
    }
    ReadAttribute<std::__cxx11::string>((string *)((long)&parentName.field_2 + 8),this,"bone");
    ReadAttribute<std::__cxx11::string>((string *)&bone,this,"parent");
    parent = Skeleton::BoneByName(local_18,(string *)((long)&parentName.field_2 + 8));
    local_a0 = Skeleton::BoneByName(local_18,(string *)&bone);
    if ((parent == (Bone *)0x0) || (local_a0 == (Bone *)0x0)) break;
    Bone::AddChild(local_a0,parent);
    std::__cxx11::string::~string((string *)&bone);
    std::__cxx11::string::~string((string *)(parentName.field_2._M_local_buf + 8));
  }
  pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_100,"Failed to find bones for parenting: Child ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&parentName.field_2 + 8));
  std::operator+(&local_e0,&local_100," for parent ");
  std::operator+(&local_c0,&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bone);
  DeadlyImportError::DeadlyImportError(pDVar2,&local_c0);
  __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreXmlSerializer::ReadBoneHierarchy(Skeleton *skeleton)
{
    if (skeleton->bones.empty()) {
        throw DeadlyImportError("Cannot read <bonehierarchy> for a Skeleton without bones");
    }

    while(NextNode() == nnBoneParent)
    {
        const std::string name = ReadAttribute<std::string>("bone");
        const std::string parentName = ReadAttribute<std::string>("parent");

        Bone *bone = skeleton->BoneByName(name);
        Bone *parent = skeleton->BoneByName(parentName);

        if (bone && parent)
            parent->AddChild(bone);
        else
            throw DeadlyImportError("Failed to find bones for parenting: Child " + name + " for parent " + parentName);
    }

    // Calculate bone matrices for root bones. Recursively calculates their children.
    for (size_t i=0, len=skeleton->bones.size(); i<len; ++i)
    {
        Bone *bone = skeleton->bones[i];
        if (!bone->IsParented())
            bone->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}